

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool mkvmuxer::anon_unknown_12::StrCpy(char *src,char **dst_ptr)

{
  size_t sVar1;
  char *pcVar2;
  size_t size;
  char **dst;
  char **dst_ptr_local;
  char *src_local;
  
  if (dst_ptr == (char **)0x0) {
    src_local._7_1_ = false;
  }
  else {
    if (*dst_ptr != (char *)0x0) {
      operator_delete__(*dst_ptr);
    }
    *dst_ptr = (char *)0x0;
    if (src == (char *)0x0) {
      src_local._7_1_ = true;
    }
    else {
      sVar1 = strlen(src);
      pcVar2 = (char *)operator_new__(sVar1 + 1,(nothrow_t *)&std::nothrow);
      *dst_ptr = pcVar2;
      if (*dst_ptr == (char *)0x0) {
        src_local._7_1_ = false;
      }
      else {
        strcpy(*dst_ptr,src);
        src_local._7_1_ = true;
      }
    }
  }
  return src_local._7_1_;
}

Assistant:

bool StrCpy(const char* src, char** dst_ptr) {
  if (dst_ptr == NULL)
    return false;

  char*& dst = *dst_ptr;

  delete[] dst;
  dst = NULL;

  if (src == NULL)
    return true;

  const size_t size = strlen(src) + 1;

  dst = new (std::nothrow) char[size];  // NOLINT
  if (dst == NULL)
    return false;

  strcpy(dst, src);  // NOLINT
  return true;
}